

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

void __thiscall xLearn::Trainer::Train(Trainer *this)

{
  size_type sVar1;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_RDI;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> te_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> tr_reader;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_00000090;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_00000098;
  Trainer *in_stack_000000a0;
  value_type *in_stack_ffffffffffffffb8;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_ffffffffffffffc0;
  
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::vector
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)0x1b5c81);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[](in_RDI,0);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::vector
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)0x1b5ca7);
  sVar1 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size(in_RDI);
  if (sVar1 == 2) {
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[](in_RDI,1);
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::push_back
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  train(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~vector
            (in_stack_ffffffffffffffc0);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::~vector
            (in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void Trainer::Train() {
  // Get train Reader and test Reader
  std::vector<Reader*> tr_reader;
  tr_reader.push_back(reader_list_[0]);
  std::vector<Reader*> te_reader;
  if (reader_list_.size() == 2) {
    te_reader.push_back(reader_list_[1]);
  }
  this->train(tr_reader, te_reader);
}